

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobjectdefs.h
# Opt level: O0

void QMetaObject::activate<void,QRegularExpression>
               (QObject *sender,QMetaObject *mo,int local_signal_index,void *ret,
               QRegularExpression *args)

{
  int in_EDX;
  QMetaObject *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  void *_a [2];
  void *local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QMetaObject::activate(in_RDI,in_RSI,in_EDX,local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void
    activate(QObject *sender, const QMetaObject *mo, int local_signal_index, Ret *ret, const Args &... args)
    {
        void *_a[] = {
            const_cast<void *>(reinterpret_cast<const volatile void *>(ret)),
            const_cast<void *>(reinterpret_cast<const volatile void *>(std::addressof(args)))...
        };
        activate(sender, mo, local_signal_index, _a);
    }